

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaFixupComplexType(xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr type)

{
  byte *pbVar1;
  xmlSchemaContentType xVar2;
  xmlSchemaContentType xVar3;
  xmlSchemaTypeType xVar4;
  xmlSchemaTreeItemPtr_conflict pxVar5;
  long *plVar6;
  void *pvVar7;
  xmlSchemaWildcardPtr pxVar8;
  xmlSchemaWildcardPtr pxVar9;
  bool bVar10;
  bool bVar11;
  _xmlSchemaWildcardNs **pp_Var12;
  int iVar13;
  uint uVar14;
  int iVar15;
  xmlChar *pxVar16;
  xmlSchemaTypePtr pxVar17;
  xmlNodePtr pxVar18;
  xmlSchemaTypePtr pxVar19;
  xmlSchemaItemListPtr list;
  xmlSchemaWildcardNsPtr pxVar20;
  xmlSchemaTypePtr pxVar21;
  xmlSchemaModelGroupPtr pxVar22;
  xmlSchemaParticlePtr pxVar23;
  _xmlSchemaWildcardNs *p_Var24;
  xmlSchemaWildcardNsPtr pxVar25;
  _xmlSchemaWildcardNs *p_Var26;
  ulong uVar27;
  char *funcName;
  char *in_R8;
  char *pcVar28;
  long lVar29;
  xmlNodePtr file;
  xmlNodePtr in_R9;
  xmlSchemaItemListPtr pxVar30;
  xmlSchemaTreeItemPtr_conflict effectiveContent;
  long lVar31;
  xmlSchemaWildcardNsPtr pxVar32;
  int in_stack_ffffffffffffff80;
  uint local_54;
  xmlChar *local_40;
  int local_34;
  
  if (type->type == XML_SCHEMA_TYPE_BASIC) {
    return 0;
  }
  if (((uint)type->flags >> 0x16 & 1) != 0) {
    return 0;
  }
  iVar15 = pctxt->nberrors;
  pxVar17 = type->baseType;
  type->flags = type->flags | 0x400000;
  if (pxVar17 == (xmlSchemaTypePtr)0x0) {
    funcName = "xmlSchemaFixupComplexType";
    pcVar28 = "missing baseType";
LAB_001a0d93:
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)pctxt,funcName,pcVar28,(xmlChar *)0x0,(xmlChar *)in_R8);
    goto LAB_001a0d9d;
  }
  if ((pxVar17->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar17->flags & 0x400000) == 0)) {
    xmlSchemaTypeFixup(pxVar17,(xmlSchemaAbstractCtxtPtr)pctxt);
  }
  if ((pxVar17->flags & 0x800000) != 0) {
    return 0;
  }
  pxVar19 = type->baseType;
  xVar2 = type->contentType;
  if ((xVar2 | XML_SCHEMA_CONTENT_ELEMENTS) == XML_SCHEMA_CONTENT_BASIC) {
    if ((pxVar19->type != XML_SCHEMA_TYPE_SIMPLE) &&
       ((pxVar19->type != XML_SCHEMA_TYPE_BASIC || (pxVar19->builtInType == 0x2d)))) {
      xVar3 = pxVar19->contentType;
      if (xVar3 == XML_SCHEMA_CONTENT_MIXED) {
        if ((type->flags & 4) == 0) {
          pcVar28 = 
          "If <simpleContent> and <extension> is used, the base type must be a simple type. The base type \'%s\' is a complex type"
          ;
        }
        else {
          iVar13 = xmlSchemaIsParticleEmptiable((xmlSchemaParticlePtr)pxVar19->subtypes);
          if (iVar13 != 0) {
            if (type->contentTypeDef == (xmlSchemaTypePtr)0x0) {
              local_40 = (xmlChar *)0x0;
              pxVar16 = xmlSchemaFormatQName(&local_40,pxVar19->targetNamespace,pxVar19->name);
              pcVar28 = 
              "A <simpleType> is expected among the children of <restriction>, if <simpleContent> is used and the base type \'%s\' is a complex type"
              ;
              goto LAB_001a0e3c;
            }
            goto LAB_001a0f08;
          }
          pcVar28 = 
          "If <simpleContent> and <restriction> is used, the base type must be a simple type or a complex type with mixed content and particle emptiable. The base type \'%s\' is none of those"
          ;
        }
      }
      else {
        if ((xVar3 == XML_SCHEMA_CONTENT_SIMPLE) || (xVar3 == XML_SCHEMA_CONTENT_BASIC)) {
          if (pxVar19->contentTypeDef != (xmlSchemaTypePtr)0x0) goto LAB_001a0f08;
          pxVar16 = type->name;
          pcVar28 = "Internal error: xmlSchemaCheckSRCCT, \'%s\', base type has no content type";
          goto LAB_001a0fac;
        }
        pcVar28 = 
        "If <simpleContent> and <restriction> is used, the base type must be a simple type or a complex type with mixed content and particle emptiable. The base type \'%s\' is none of those"
        ;
        if ((type->flags & 4) == 0) {
          pcVar28 = 
          "If <simpleContent> and <extension> is used, the base type must be a simple type. The base type \'%s\' is a complex type"
          ;
        }
      }
      local_40 = (xmlChar *)0x0;
      pxVar16 = xmlSchemaFormatQName(&local_40,pxVar19->targetNamespace,pxVar19->name);
      xmlSchemaPCustomErrExt
                (pctxt,XML_SCHEMAP_SRC_CT_1,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,pcVar28,
                 pxVar16,(xmlChar *)0x0,(xmlChar *)0x0);
      goto LAB_001a0ec2;
    }
    if ((type->flags & 2) == 0) {
      local_40 = (xmlChar *)0x0;
      pxVar16 = xmlSchemaFormatQName(&local_40,pxVar19->targetNamespace,pxVar19->name);
      pcVar28 = 
      "If using <simpleContent> and <restriction>, the base type must be a complex type. The base type \'%s\' is a simple type"
      ;
LAB_001a0e3c:
      pxVar18 = (xmlNodePtr)0x0;
      goto LAB_001a0e49;
    }
LAB_001a0f08:
    local_34 = iVar15;
    if (xVar2 != XML_SCHEMA_CONTENT_SIMPLE) {
      pxVar19 = type->subtypes;
      if (pxVar19 == (xmlSchemaTypePtr)0x0) {
        uVar14 = type->flags;
        if ((uVar14 & 1) == 0) {
LAB_001a1038:
          type->contentType = XML_SCHEMA_CONTENT_EMPTY;
          if ((uVar14 & 4) == 0) {
            type->contentType = pxVar17->contentType;
            type->subtypes = pxVar17->subtypes;
            type->contentTypeDef = pxVar17->contentTypeDef;
          }
          goto LAB_001a12af;
        }
LAB_001a1240:
        pxVar19 = (xmlSchemaTypePtr)xmlSchemaAddParticle(pctxt,type->node,1,1);
        if (pxVar19 == (xmlSchemaTypePtr)0x0) goto LAB_001a0d9d;
        pxVar22 = xmlSchemaAddModelGroup(pctxt,pctxt->schema,XML_SCHEMA_TYPE_SEQUENCE,type->node);
        pxVar19->id = (xmlChar *)pxVar22;
        if (pxVar22 == (xmlSchemaModelGroupPtr)0x0) goto LAB_001a0d9d;
        type->subtypes = pxVar19;
        bVar10 = true;
      }
      else {
        if (pxVar19->type == XML_SCHEMA_TYPE_PARTICLE) {
          xVar4 = ((xmlSchemaTreeItemPtr_conflict)pxVar19->id)->type;
          if ((((xVar4 == XML_SCHEMA_TYPE_SEQUENCE) || (xVar4 == XML_SCHEMA_TYPE_ALL)) ||
              ((xVar4 == XML_SCHEMA_TYPE_CHOICE && (*(int *)&pxVar19->ref == 0)))) &&
             (((xmlSchemaTreeItemPtr_conflict)pxVar19->id)->children == (xmlSchemaTreeItemPtr)0x0))
          {
            uVar14 = type->flags;
            if ((uVar14 & 1) == 0) goto LAB_001a1038;
            bVar10 = true;
            if (xVar4 != XML_SCHEMA_TYPE_SEQUENCE) goto LAB_001a1240;
            goto LAB_001a0ffe;
          }
        }
        bVar10 = false;
      }
LAB_001a0ffe:
      type->contentType = XML_SCHEMA_CONTENT_ELEMENTS;
      uVar14 = type->flags;
      if (((uVar14 & 4) != 0) || (pxVar17->contentType == XML_SCHEMA_CONTENT_EMPTY)) {
        if ((uVar14 & 1) != 0) {
          type->contentType = XML_SCHEMA_CONTENT_MIXED;
        }
        goto LAB_001a12af;
      }
      if ((uVar14 & 1) != 0) {
        type->contentType = XML_SCHEMA_CONTENT_MIXED;
      }
      pxVar5 = (xmlSchemaTreeItemPtr_conflict)pxVar19->id;
      if ((pxVar5 == (xmlSchemaTreeItemPtr_conflict)0x0) || (pxVar5->type != XML_SCHEMA_TYPE_ALL)) {
        pxVar21 = pxVar17->subtypes;
        if (pxVar21 != (xmlSchemaTypePtr)0x0) {
          if (((int *)pxVar21->id != (int *)0x0) && (*(int *)pxVar21->id == 8)) {
            pxVar18 = xmlSchemaGetComponentNode((xmlSchemaBasicItemPtr)type);
            in_R8 = 
            "A type cannot be derived by extension from a type which has an \'all\' model group in its {content type}, since this would produce a \'sequence\' model group containing the \'all\' model group; \'all\' model groups are not allowed to appear inside other model groups"
            ;
            goto LAB_001a11cd;
          }
          if (!bVar10) {
            pxVar21 = (xmlSchemaTypePtr)xmlSchemaAddParticle(pctxt,type->node,1,1);
            if (pxVar21 == (xmlSchemaTypePtr)0x0) goto LAB_001a0d9d;
            pxVar22 = xmlSchemaAddModelGroup
                                (pctxt,pctxt->schema,XML_SCHEMA_TYPE_SEQUENCE,type->node);
            pxVar21->id = (xmlChar *)pxVar22;
            if (pxVar22 == (xmlSchemaModelGroupPtr)0x0) goto LAB_001a0d9d;
            type->subtypes = pxVar21;
            pxVar23 = xmlSchemaAddParticle
                                (pctxt,type->node,*(int *)&pxVar17->subtypes->ref,
                                 *(int *)((long)&pxVar17->subtypes->ref + 4));
            ((xmlSchemaTreeItemPtr_conflict)pxVar21->id)->children = (xmlSchemaTreeItemPtr)pxVar23;
            if (pxVar23 == (xmlSchemaParticlePtr)0x0) goto LAB_001a0d9d;
            pxVar23->children = (xmlSchemaTreeItemPtr_conflict)pxVar17->subtypes->id;
            pxVar23->next = (xmlSchemaTreeItemPtr_conflict)pxVar19;
            goto LAB_001a12af;
          }
        }
        pxVar5->children = (xmlSchemaTreeItemPtr)pxVar21;
      }
      else {
        pxVar18 = xmlSchemaGetComponentNode((xmlSchemaBasicItemPtr)type);
        in_R8 = 
        "The type has an \'all\' model group in its {content type} and thus cannot be derived from a non-empty type, since this would produce a \'sequence\' model group containing the \'all\' model group; \'all\' model groups are not allowed to appear inside other model groups"
        ;
LAB_001a11cd:
        in_R9 = (xmlNodePtr)0x0;
        xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_COS_ALL_LIMITED,pxVar18,
                            (xmlSchemaBasicItemPtr)0x0,in_R8,(xmlChar *)0x0,(xmlChar *)0x0,
                            (xmlChar *)0x0,(xmlChar *)0x0);
      }
      goto LAB_001a12af;
    }
    xVar4 = pxVar17->type;
    if ((xVar4 == XML_SCHEMA_TYPE_COMPLEX) || (pxVar17->builtInType == 0x2d)) {
      pxVar19 = pxVar17->contentTypeDef;
      if ((pxVar19 == (xmlSchemaTypePtr)0x0) || ((type->flags & 4) == 0)) {
        if ((xVar4 != XML_SCHEMA_TYPE_COMPLEX) && (pxVar17->builtInType != 0x2d)) goto LAB_001a0f7c;
        if ((pxVar17->contentType == XML_SCHEMA_CONTENT_MIXED) && ((type->flags & 4) != 0)) {
          if ((type->contentTypeDef == (xmlSchemaTypePtr)0x0) ||
             (type->contentTypeDef->baseType == (xmlSchemaTypePtr)0x0)) {
            pxVar16 = type->name;
            pcVar28 = 
            "Internal error: xmlSchemaTypeFixup, complex type \'%s\': the <simpleContent><restriction> is missing a <simpleType> child, but was not caught by xmlSchemaCheckSRCCT()"
            ;
            goto LAB_001a0fac;
          }
        }
        else {
          if (((xVar4 != XML_SCHEMA_TYPE_COMPLEX) && (pxVar17->builtInType != 0x2d)) ||
             ((type->flags & 2) == 0)) goto LAB_001a0f7c;
          if (pxVar19 == (xmlSchemaTypePtr)0x0) {
            pxVar16 = type->name;
            pcVar28 = 
            "Internal error: xmlSchemaTypeFixup, complex type \'%s\': the <extension>ed base type is a complex type with no simple content type"
            ;
            goto LAB_001a0fac;
          }
          type->contentTypeDef = pxVar19;
        }
        goto LAB_001a12af;
      }
      pxVar17 = type->contentTypeDef;
      if (pxVar17 != (xmlSchemaTypePtr)0x0) {
        type->contentTypeDef = (xmlSchemaTypePtr)0x0;
        pxVar19 = pxVar17;
      }
      in_R9 = type->node;
      in_R8 = (char *)type->targetNamespace;
      pxVar17 = xmlSchemaAddType(pctxt,pctxt->schema,XML_SCHEMA_TYPE_SIMPLE,(xmlChar *)0x0,
                                 (xmlChar *)in_R8,in_R9,0);
      if (pxVar17 == (xmlSchemaTypePtr)0x0) goto LAB_001a0d9d;
      pxVar17->type = XML_SCHEMA_TYPE_SIMPLE;
      pxVar17->baseType = pxVar19;
      pxVar17->facets = type->facets;
      type->facets = (xmlSchemaFacetPtr)0x0;
      pxVar17->facetSet = type->facetSet;
      type->facetSet = (xmlSchemaFacetLinkPtr)0x0;
      type->contentTypeDef = pxVar17;
      if ((pxVar19->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar19->flags & 0x400000) == 0)) {
        xmlSchemaTypeFixup(pxVar19,(xmlSchemaAbstractCtxtPtr)pctxt);
      }
      iVar15 = xmlSchemaFixupSimpleTypeStageOne(pctxt,pxVar17);
      if ((iVar15 == -1) || (iVar15 = xmlSchemaFixupSimpleTypeStageTwo(pctxt,pxVar17), iVar15 == -1)
         ) goto LAB_001a0d9d;
      if (iVar15 == 0) goto LAB_001a12af;
    }
    else {
LAB_001a0f7c:
      if (((xVar4 != XML_SCHEMA_TYPE_SIMPLE) &&
          ((xVar4 != XML_SCHEMA_TYPE_BASIC || (pxVar17->builtInType == 0x2d)))) ||
         ((type->flags & 2) == 0)) {
        pxVar16 = type->name;
        pcVar28 = 
        "Internal error: xmlSchemaTypeFixup, complex type \'%s\' with <simpleContent>: unhandled derivation case"
        ;
LAB_001a0fac:
        xmlSchemaPCustomErrExt
                  (pctxt,XML_SCHEMAP_INTERNAL,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,pcVar28,
                   pxVar16,(xmlChar *)0x0,(xmlChar *)0x0);
        goto LAB_001a0d9d;
      }
      type->contentTypeDef = pxVar17;
LAB_001a12af:
      pxVar17 = type->baseType;
      if (pxVar17 == (xmlSchemaTypePtr)0x0) {
        funcName = "xmlSchemaFixupTypeAttributeUses";
        pcVar28 = "no base type";
        goto LAB_001a0d93;
      }
      if (((pxVar17->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar17->flags & 0x400000) == 0)) &&
         (iVar15 = xmlSchemaTypeFixup(pxVar17,(xmlSchemaAbstractCtxtPtr)pctxt), iVar15 == -1))
      goto LAB_001a0d9d;
      list = (xmlSchemaItemListPtr)type->attrUses;
      plVar6 = (long *)pxVar17->attrUses;
      if (list == (xmlSchemaItemListPtr)0x0) {
        pxVar30 = (xmlSchemaItemListPtr)0x0;
      }
      else if ((type->flags & 4) == 0) {
        in_R8 = (char *)0x0;
        iVar15 = xmlSchemaExpandAttributeGroupRefs
                           (pctxt,(xmlSchemaBasicItemPtr)type,&type->attributeWildcard,list,
                            (xmlSchemaItemListPtr)0x0);
        pxVar30 = (xmlSchemaItemListPtr)0x0;
        if (iVar15 == -1) {
LAB_001a13fa:
          funcName = "xmlSchemaFixupTypeAttributeUses";
          pcVar28 = "failed to expand attributes";
          goto LAB_001a0d93;
        }
      }
      else {
        in_R8 = (char *)pctxt->attrProhibs;
        iVar15 = xmlSchemaExpandAttributeGroupRefs
                           (pctxt,(xmlSchemaBasicItemPtr)type,&type->attributeWildcard,list,
                            (xmlSchemaItemListPtr)in_R8);
        if (iVar15 == -1) goto LAB_001a13fa;
        pxVar30 = (xmlSchemaItemListPtr)0x0;
        if (pctxt->attrProhibs->nbItems != 0) {
          pxVar30 = pctxt->attrProhibs;
        }
      }
      if (plVar6 == (long *)0x0) {
LAB_001a14ef:
        if (list != (xmlSchemaItemListPtr)0x0) goto LAB_001a14f4;
      }
      else {
        if ((type->flags & 4) != 0) {
          if (list == (xmlSchemaItemListPtr)0x0) {
            local_54 = 0;
          }
          else {
            local_54 = list->nbItems;
          }
          iVar15 = (int)plVar6[1];
          if (0 < iVar15) {
            lVar31 = 0;
            do {
              pvVar7 = *(void **)(*plVar6 + lVar31 * 8);
              if ((pxVar30 != (xmlSchemaItemListPtr)0x0) && (0 < (long)pxVar30->nbItems)) {
                lVar29 = 0;
                do {
                  in_R9 = (xmlNodePtr)pxVar30->items[lVar29];
                  if ((*(xmlChar **)(*(long *)((long)pvVar7 + 0x18) + 0x10) == in_R9->name) &&
                     (*(_xmlNode **)(*(long *)((long)pvVar7 + 0x18) + 0x70) == in_R9->children))
                  goto LAB_001a14e0;
                  lVar29 = lVar29 + 1;
                } while (pxVar30->nbItems != lVar29);
              }
              if (0 < (int)local_54) {
                uVar27 = 0;
                do {
                  lVar29 = *(long *)((long)list->items[uVar27] + 0x18);
                  if ((*(long *)(*(long *)((long)pvVar7 + 0x18) + 0x10) == *(long *)(lVar29 + 0x10))
                     && (in_R9 = *(xmlNodePtr *)(*(long *)((long)pvVar7 + 0x18) + 0x70),
                        in_R9 == *(xmlNodePtr *)(lVar29 + 0x70))) goto LAB_001a14e0;
                  uVar27 = uVar27 + 1;
                } while (local_54 != uVar27);
              }
              if (list == (xmlSchemaItemListPtr)0x0) {
                list = xmlSchemaItemListCreate();
                type->attrUses = list;
                if (list == (xmlSchemaItemListPtr)0x0) goto LAB_001a0d9d;
              }
              xmlSchemaItemListAddSize(list,2,pvVar7);
              iVar15 = (int)plVar6[1];
LAB_001a14e0:
              lVar31 = lVar31 + 1;
            } while (lVar31 < iVar15);
          }
          goto LAB_001a14ef;
        }
        uVar27 = (ulong)*(uint *)(plVar6 + 1);
        if ((int)*(uint *)(plVar6 + 1) < 1) goto LAB_001a14ef;
        lVar31 = 0;
        do {
          iVar15 = (int)uVar27;
          pvVar7 = *(void **)(*plVar6 + lVar31 * 8);
          if (list == (xmlSchemaItemListPtr)0x0) {
            list = xmlSchemaItemListCreate();
            type->attrUses = list;
            if (list == (xmlSchemaItemListPtr)0x0) goto LAB_001a0d9d;
            iVar15 = (int)plVar6[1];
          }
          xmlSchemaItemListAddSize(list,iVar15,pvVar7);
          lVar31 = lVar31 + 1;
          uVar27 = (ulong)(int)plVar6[1];
        } while (lVar31 < (long)uVar27);
LAB_001a14f4:
        if (list->nbItems == 0) {
          if (list->items != (void **)0x0) {
            (*xmlFree)(list->items);
          }
          (*xmlFree)(list);
          type->attrUses = (void *)0x0;
        }
      }
      if (((type->flags & 2) != 0) &&
         (pxVar8 = pxVar17->attributeWildcard, pxVar8 != (xmlSchemaWildcardPtr)0x0)) {
        pxVar9 = type->attributeWildcard;
        if (pxVar9 == (xmlSchemaWildcardPtr)0x0) {
          type->attributeWildcard = pxVar8;
        }
        else if (pxVar9->any == pxVar8->any) {
          pxVar32 = pxVar9->nsSet;
          p_Var26 = pxVar8->nsSet;
          if ((pxVar32 == (xmlSchemaWildcardNsPtr)0x0) != (p_Var26 != (xmlSchemaWildcardNsPtr)0x0))
          {
            pxVar20 = pxVar9->negNsSet;
            if (((pxVar20 == (xmlSchemaWildcardNsPtr)0x0) !=
                 (pxVar8->negNsSet != (xmlSchemaWildcardNsPtr)0x0)) &&
               ((pxVar20 == (xmlSchemaWildcardNsPtr)0x0 ||
                (pxVar20->value == pxVar8->negNsSet->value)))) {
              if (pxVar32 != (xmlSchemaWildcardNsPtr)0x0) {
                pxVar20 = (xmlSchemaWildcardNsPtr)&pxVar8->nsSet;
                p_Var24 = pxVar32;
                do {
                  pxVar20 = pxVar20->next;
                  if (pxVar20 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001a15ae;
                } while ((p_Var24->value != pxVar20->value) ||
                        (p_Var24 = p_Var24->next, pxVar20 = (xmlSchemaWildcardNsPtr)&pxVar8->nsSet,
                        p_Var24 != (_xmlSchemaWildcardNs *)0x0));
              }
              goto LAB_001a1ac2;
            }
          }
LAB_001a15ae:
          if ((pxVar32 == (xmlSchemaWildcardNsPtr)0x0) || (p_Var26 == (xmlSchemaWildcardNsPtr)0x0))
          {
            pxVar20 = pxVar9->negNsSet;
            pxVar25 = pxVar8->negNsSet;
            p_Var24 = pxVar32;
            if (pxVar20 == (xmlSchemaWildcardNsPtr)0x0) {
LAB_001a1795:
              if (((pxVar25 == (xmlSchemaWildcardNsPtr)0x0) ||
                  (pxVar32 == (xmlSchemaWildcardNsPtr)0x0)) || (pxVar25->value == (xmlChar *)0x0)) {
                if (((pxVar20 == (xmlSchemaWildcardNsPtr)0x0) ||
                    (p_Var26 == (xmlSchemaWildcardNsPtr)0x0)) || (pxVar20->value != (xmlChar *)0x0))
                {
                  if (((pxVar25 == (xmlSchemaWildcardNsPtr)0x0) ||
                      (pxVar32 == (xmlSchemaWildcardNsPtr)0x0)) ||
                     (p_Var26 = pxVar32, pxVar25->value != (xmlChar *)0x0)) goto LAB_001a1ac2;
                }
                else if (pxVar32 != (xmlSchemaWildcardNsPtr)0x0) {
                  p_Var26 = pxVar32;
                }
                do {
                  if (p_Var26->value == (xmlChar *)0x0) {
                    pxVar9->any = 1;
                    if (pxVar32 != (xmlSchemaWildcardNsPtr)0x0) {
                      do {
                        p_Var26 = pxVar32->next;
                        (*xmlFree)(pxVar32);
                        pxVar32 = p_Var26;
                      } while (p_Var26 != (_xmlSchemaWildcardNs *)0x0);
                      pxVar9->nsSet = (xmlSchemaWildcardNsPtr)0x0;
                      pxVar20 = pxVar9->negNsSet;
                    }
                    goto joined_r0x001a19f0;
                  }
                  pp_Var12 = &p_Var26->next;
                  p_Var26 = *pp_Var12;
                } while (*pp_Var12 != (_xmlSchemaWildcardNs *)0x0);
                if (pxVar20 != (xmlSchemaWildcardNsPtr)0x0) goto LAB_001a1ac2;
                if (pxVar32 != (xmlSchemaWildcardNsPtr)0x0) {
                  do {
                    p_Var26 = pxVar32->next;
                    (*xmlFree)(pxVar32);
                    pxVar32 = p_Var26;
                  } while (p_Var26 != (_xmlSchemaWildcardNs *)0x0);
                  pxVar9->nsSet = (xmlSchemaWildcardNsPtr)0x0;
                }
                pxVar20 = (xmlSchemaWildcardNsPtr)(*xmlMalloc)(0x10);
                if (pxVar20 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001a1af8;
                pxVar16 = (xmlChar *)0x0;
                pxVar20->next = (_xmlSchemaWildcardNs *)0x0;
                pxVar9->negNsSet = pxVar20;
LAB_001a1ab9:
                pxVar20->value = pxVar16;
              }
              else {
LAB_001a17b8:
                bVar10 = false;
                pxVar18 = (xmlNodePtr)0x0;
                do {
                  if (p_Var24->value == (xmlChar *)0x0) {
                    bVar10 = true;
                    file = pxVar18;
                  }
                  else {
                    file = (xmlNodePtr)&DAT_00000001;
                    in_R9 = (xmlNodePtr)&DAT_00000001;
                    if (p_Var24->value != pxVar25->value) {
                      file = pxVar18;
                      in_R9 = pxVar18;
                    }
                  }
                  iVar13 = (int)file;
                  in_R9 = (xmlNodePtr)CONCAT71((int7)((ulong)in_R9 >> 8),iVar13 != 0);
                  iVar15 = 1;
                  bVar11 = true;
                } while ((iVar13 == 0 || !bVar10) &&
                        (p_Var24 = p_Var24->next, pxVar18 = file, iVar15 = iVar13, bVar11 = bVar10,
                        p_Var24 != (_xmlSchemaWildcardNs *)0x0));
                if (iVar15 != 0 && bVar11) {
                  pxVar9->any = 1;
                  if (pxVar32 != (xmlSchemaWildcardNsPtr)0x0) {
                    do {
                      p_Var26 = pxVar32->next;
                      (*xmlFree)(pxVar32);
                      pxVar32 = p_Var26;
                    } while (p_Var26 != (_xmlSchemaWildcardNs *)0x0);
                    pxVar9->nsSet = (xmlSchemaWildcardNsPtr)0x0;
                    pxVar20 = pxVar9->negNsSet;
                  }
                  goto joined_r0x001a19f0;
                }
                if (iVar15 == 0 || bVar11) {
                  if (bVar11 && iVar15 == 0) {
                    xmlSchemaPErrFull(pctxt,pxVar9->node,0x702,XML_ERR_ERROR,(char *)file,(int)in_R9
                                      ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,
                                      in_stack_ffffffffffffff80,
                                      "The union of the wildcard is not expressible.\n",0,0);
                  }
                  else if (((pxVar20 == (xmlSchemaWildcardNsPtr)0x0) && (iVar15 == 0)) && (!bVar11))
                  {
                    if (pxVar32 != (xmlSchemaWildcardNsPtr)0x0) {
                      do {
                        p_Var26 = pxVar32->next;
                        (*xmlFree)(pxVar32);
                        pxVar32 = p_Var26;
                      } while (p_Var26 != (_xmlSchemaWildcardNs *)0x0);
                      pxVar9->nsSet = (xmlSchemaWildcardNsPtr)0x0;
                    }
                    pxVar20 = (xmlSchemaWildcardNsPtr)(*xmlMalloc)(0x10);
                    if (pxVar20 != (xmlSchemaWildcardNsPtr)0x0) {
                      pxVar20->next = (_xmlSchemaWildcardNs *)0x0;
                      pxVar20->value = (xmlChar *)0x0;
                      pxVar9->negNsSet = pxVar20;
                      pxVar16 = pxVar8->negNsSet->value;
                      goto LAB_001a1ab9;
                    }
LAB_001a1af8:
                    xmlSchemaPErrMemory(pctxt);
                    pxVar9->negNsSet = (xmlSchemaWildcardNsPtr)0x0;
                    goto LAB_001a0d9d;
                  }
                }
                else {
                  if (pxVar32 != (xmlSchemaWildcardNsPtr)0x0) {
                    do {
                      p_Var26 = pxVar32->next;
                      (*xmlFree)(pxVar32);
                      pxVar32 = p_Var26;
                    } while (p_Var26 != (_xmlSchemaWildcardNs *)0x0);
                    pxVar9->nsSet = (xmlSchemaWildcardNsPtr)0x0;
                    pxVar20 = pxVar9->negNsSet;
                  }
                  if (pxVar20 == (xmlSchemaWildcardNsPtr)0x0) {
                    pxVar20 = (xmlSchemaWildcardNsPtr)(*xmlMalloc)(0x10);
                    if (pxVar20 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001a1af8;
                    pxVar20->next = (_xmlSchemaWildcardNs *)0x0;
                    pxVar20->value = (xmlChar *)0x0;
                    pxVar9->negNsSet = pxVar20;
                  }
                  pxVar20->value = (xmlChar *)0x0;
                }
              }
            }
            else {
              if ((pxVar25 == (xmlSchemaWildcardNsPtr)0x0) || (pxVar20->value == pxVar25->value)) {
                if ((p_Var26 == (xmlSchemaWildcardNsPtr)0x0) || (pxVar20->value == (xmlChar *)0x0))
                goto LAB_001a1795;
                if (pxVar32 == (xmlSchemaWildcardNsPtr)0x0) {
                  pxVar25 = pxVar20;
                  p_Var24 = p_Var26;
                }
                goto LAB_001a17b8;
              }
              pxVar20->value = (xmlChar *)0x0;
            }
          }
          else {
            do {
              p_Var24 = pxVar32;
              do {
                if (p_Var26->value == p_Var24->value) goto LAB_001a1609;
                p_Var24 = p_Var24->next;
              } while (p_Var24 != (_xmlSchemaWildcardNs *)0x0);
              pxVar20 = (xmlSchemaWildcardNsPtr)(*xmlMalloc)(0x10);
              if (pxVar20 == (xmlSchemaWildcardNsPtr)0x0) {
                xmlSchemaPErrMemory(pctxt);
                goto LAB_001a0d9d;
              }
              pxVar20->next = (_xmlSchemaWildcardNs *)0x0;
              pxVar20->value = (xmlChar *)0x0;
              pxVar20->value = p_Var26->value;
              pxVar20->next = pxVar9->nsSet;
              pxVar9->nsSet = pxVar20;
LAB_001a1609:
              p_Var26 = p_Var26->next;
            } while (p_Var26 != (_xmlSchemaWildcardNs *)0x0);
          }
        }
        else if (pxVar9->any == 0) {
          pxVar9->any = 1;
          pxVar20 = pxVar9->nsSet;
          if (pxVar20 != (xmlSchemaWildcardNsPtr)0x0) {
            do {
              p_Var26 = pxVar20->next;
              (*xmlFree)(pxVar20);
              pxVar20 = p_Var26;
            } while (p_Var26 != (_xmlSchemaWildcardNs *)0x0);
            pxVar9->nsSet = (xmlSchemaWildcardNsPtr)0x0;
          }
          pxVar20 = pxVar9->negNsSet;
joined_r0x001a19f0:
          if (pxVar20 != (xmlSchemaWildcardNsPtr)0x0) {
            (*xmlFree)(pxVar20);
            pxVar9->negNsSet = (xmlSchemaWildcardNsPtr)0x0;
          }
        }
      }
LAB_001a1ac2:
      iVar15 = xmlSchemaCheckCTComponent(pctxt,type);
      if (iVar15 == -1) {
LAB_001a0d9d:
        pbVar1 = (byte *)((long)&type->flags + 2);
        *pbVar1 = *pbVar1 | 0x80;
        return -1;
      }
      if (iVar15 == 0) {
        if (local_34 == pctxt->nberrors) {
          return 0;
        }
        goto LAB_001a0ed4;
      }
    }
  }
  else {
    if ((pxVar19->type == XML_SCHEMA_TYPE_COMPLEX) || (pxVar19->builtInType == 0x2d))
    goto LAB_001a0f08;
    local_40 = (xmlChar *)0x0;
    pxVar18 = type->node;
    pxVar16 = xmlSchemaFormatQName(&local_40,pxVar19->targetNamespace,pxVar19->name);
    pcVar28 = 
    "If using <complexContent>, the base type is expected to be a complex type. The base type \'%s\' is a simple type"
    ;
LAB_001a0e49:
    xmlSchemaPCustomErrExt
              (pctxt,XML_SCHEMAP_SRC_CT_1,(xmlSchemaBasicItemPtr)type,pxVar18,pcVar28,pxVar16,
               (xmlChar *)0x0,(xmlChar *)0x0);
LAB_001a0ec2:
    if (local_40 != (xmlChar *)0x0) {
      (*xmlFree)(local_40);
    }
  }
  pbVar1 = (byte *)((long)&type->flags + 2);
  *pbVar1 = *pbVar1 | 0x80;
LAB_001a0ed4:
  return pctxt->err;
}

Assistant:

static int
xmlSchemaFixupComplexType(xmlSchemaParserCtxtPtr pctxt,
			  xmlSchemaTypePtr type)
{
    int res = 0, olderrs = pctxt->nberrors;
    xmlSchemaTypePtr baseType = type->baseType;

    if (! WXS_IS_TYPE_NOT_FIXED(type))
	return(0);
    type->flags |= XML_SCHEMAS_TYPE_INTERNAL_RESOLVED;
    if (baseType == NULL) {
	PERROR_INT("xmlSchemaFixupComplexType",
	    "missing baseType");
	goto exit_failure;
    }
    /*
    * Fixup the base type.
    */
    if (WXS_IS_TYPE_NOT_FIXED(baseType))
	xmlSchemaTypeFixup(baseType, ACTXT_CAST pctxt);
    if (baseType->flags & XML_SCHEMAS_TYPE_INTERNAL_INVALID) {
	/*
	* Skip fixup if the base type is invalid.
	* TODO: Generate a warning!
	*/
	return(0);
    }
    /*
    * This basically checks if the base type can be derived.
    */
    res = xmlSchemaCheckSRCCT(pctxt, type);
    HFAILURE HERROR
    /*
    * Fixup the content type.
    */
    if (type->contentType == XML_SCHEMA_CONTENT_SIMPLE) {
	/*
	* Corresponds to <complexType><simpleContent>...
	*/
	if ((WXS_IS_COMPLEX(baseType)) &&
	    (baseType->contentTypeDef != NULL) &&
	    (WXS_IS_RESTRICTION(type))) {
	    xmlSchemaTypePtr contentBase, content;
#ifdef ENABLE_NAMED_LOCALS
	    char buf[30];
	    const xmlChar *tmpname;
#endif
	    /*
	    * SPEC (1) If <restriction> + base type is <complexType>,
	    * "whose own {content type} is a simple type..."
	    */
	    if (type->contentTypeDef != NULL) {
		/*
		* SPEC (1.1) "the simple type definition corresponding to the
		* <simpleType> among the [children] of <restriction> if there
		* is one;"
		* Note that this "<simpleType> among the [children]" was put
		* into ->contentTypeDef during parsing.
		*/
		contentBase = type->contentTypeDef;
		type->contentTypeDef = NULL;
	    } else {
		/*
		* (1.2) "...otherwise (<restriction> has no <simpleType>
		* among its [children]), the simple type definition which
		* is the {content type} of the ... base type."
		*/
		contentBase = baseType->contentTypeDef;
	    }
	    /*
	    * SPEC
	    * "... a simple type definition which restricts the simple
	    * type definition identified in clause 1.1 or clause 1.2
	    * with a set of facet components"
	    *
	    * Create the anonymous simple type, which will be the content
	    * type of the complex type.
	    */
#ifdef ENABLE_NAMED_LOCALS
	    snprintf(buf, 29, "#scST%d", ++(pctxt->counter));
	    tmpname = xmlDictLookup(pctxt->dict, BAD_CAST buf, -1);
	    content = xmlSchemaAddType(pctxt, pctxt->schema,
		XML_SCHEMA_TYPE_SIMPLE, tmpname, type->targetNamespace,
		type->node, 0);
#else
	    content = xmlSchemaAddType(pctxt, pctxt->schema,
		XML_SCHEMA_TYPE_SIMPLE, NULL, type->targetNamespace,
		type->node, 0);
#endif
	    if (content == NULL)
		goto exit_failure;
	    /*
	    * We will use the same node as for the <complexType>
	    * to have it somehow anchored in the schema doc.
	    */
	    content->type = XML_SCHEMA_TYPE_SIMPLE;
	    content->baseType = contentBase;
	    /*
	    * Move the facets, previously anchored on the
	    * complexType during parsing.
	    */
	    content->facets = type->facets;
	    type->facets = NULL;
	    content->facetSet = type->facetSet;
	    type->facetSet = NULL;

	    type->contentTypeDef = content;
	    if (WXS_IS_TYPE_NOT_FIXED(contentBase))
		xmlSchemaTypeFixup(contentBase, ACTXT_CAST pctxt);
	    /*
	    * Fixup the newly created type. We don't need to check
	    * for circularity here.
	    */
	    res = xmlSchemaFixupSimpleTypeStageOne(pctxt, content);
	    HFAILURE HERROR
	    res = xmlSchemaFixupSimpleTypeStageTwo(pctxt, content);
	    HFAILURE HERROR

	} else if ((WXS_IS_COMPLEX(baseType)) &&
	    (baseType->contentType == XML_SCHEMA_CONTENT_MIXED) &&
	    (WXS_IS_RESTRICTION(type))) {
	    /*
	    * SPEC (2) If <restriction> + base is a mixed <complexType> with
	    * an emptiable particle, then a simple type definition which
	    * restricts the <restriction>'s <simpleType> child.
	    */
	    if ((type->contentTypeDef == NULL) ||
		(type->contentTypeDef->baseType == NULL)) {
		/*
		* TODO: Check if this ever happens.
		*/
		xmlSchemaPCustomErr(pctxt,
		    XML_SCHEMAP_INTERNAL,
		    WXS_BASIC_CAST type, NULL,
		    "Internal error: xmlSchemaTypeFixup, "
		    "complex type '%s': the <simpleContent><restriction> "
		    "is missing a <simpleType> child, but was not caught "
		    "by xmlSchemaCheckSRCCT()", type->name);
		goto exit_failure;
	    }
	} else if ((WXS_IS_COMPLEX(baseType)) && WXS_IS_EXTENSION(type)) {
	    /*
	    * SPEC (3) If <extension> + base is <complexType> with
	    * <simpleType> content, "...then the {content type} of that
	    * complex type definition"
	    */
	    if (baseType->contentTypeDef == NULL) {
		/*
		* TODO: Check if this ever happens. xmlSchemaCheckSRCCT
		* should have caught this already.
		*/
		xmlSchemaPCustomErr(pctxt,
		    XML_SCHEMAP_INTERNAL,
		    WXS_BASIC_CAST type, NULL,
		    "Internal error: xmlSchemaTypeFixup, "
		    "complex type '%s': the <extension>ed base type is "
		    "a complex type with no simple content type",
		    type->name);
		goto exit_failure;
	    }
	    type->contentTypeDef = baseType->contentTypeDef;
	} else if ((WXS_IS_SIMPLE(baseType)) && WXS_IS_EXTENSION(type)) {
	    /*
	    * SPEC (4) <extension> + base is <simpleType>
	    * "... then that simple type definition"
	    */
	    type->contentTypeDef = baseType;
	} else {
	    /*
	    * TODO: Check if this ever happens.
	    */
	    xmlSchemaPCustomErr(pctxt,
		XML_SCHEMAP_INTERNAL,
		WXS_BASIC_CAST type, NULL,
		"Internal error: xmlSchemaTypeFixup, "
		"complex type '%s' with <simpleContent>: unhandled "
		"derivation case", type->name);
	    goto exit_failure;
	}
    } else {
	int dummySequence = 0;
	xmlSchemaParticlePtr particle =
	    (xmlSchemaParticlePtr) type->subtypes;
	/*
	* Corresponds to <complexType><complexContent>...
	*
	* NOTE that the effective mixed was already set during parsing of
	* <complexType> and <complexContent>; its flag value is
	* XML_SCHEMAS_TYPE_MIXED.
	*
	* Compute the "effective content":
	* (2.1.1) + (2.1.2) + (2.1.3)
	*/
	if ((particle == NULL) ||
	    ((particle->type == XML_SCHEMA_TYPE_PARTICLE) &&
	    ((particle->children->type == XML_SCHEMA_TYPE_ALL) ||
	    (particle->children->type == XML_SCHEMA_TYPE_SEQUENCE) ||
	    ((particle->children->type == XML_SCHEMA_TYPE_CHOICE) &&
	    (particle->minOccurs == 0))) &&
	    ( ((xmlSchemaTreeItemPtr) particle->children)->children == NULL))) {
	    if (type->flags & XML_SCHEMAS_TYPE_MIXED) {
		/*
		* SPEC (2.1.4) "If the `effective mixed` is true, then
		* a particle whose properties are as follows:..."
		*
		* Empty sequence model group with
		* minOccurs/maxOccurs = 1 (i.e. a "particle emptiable").
		* NOTE that we sill assign it the <complexType> node to
		* somehow anchor it in the doc.
		*/
		if ((particle == NULL) ||
		    (particle->children->type != XML_SCHEMA_TYPE_SEQUENCE)) {
		    /*
		    * Create the particle.
		    */
		    particle = xmlSchemaAddParticle(pctxt,
			type->node, 1, 1);
		    if (particle == NULL)
			goto exit_failure;
		    /*
		    * Create the model group.
		    */ /* URGENT TODO: avoid adding to pending items. */
		    particle->children = (xmlSchemaTreeItemPtr)
			xmlSchemaAddModelGroup(pctxt, pctxt->schema,
			XML_SCHEMA_TYPE_SEQUENCE, type->node);
		    if (particle->children == NULL)
			goto exit_failure;

		    type->subtypes = (xmlSchemaTypePtr) particle;
		}
		dummySequence = 1;
		type->contentType = XML_SCHEMA_CONTENT_ELEMENTS;
	    } else {
		/*
		* SPEC (2.1.5) "otherwise empty"
		*/
		type->contentType = XML_SCHEMA_CONTENT_EMPTY;
	    }
	} else {
	    /*
	    * SPEC (2.2) "otherwise the particle corresponding to the
	    * <all>, <choice>, <group> or <sequence> among the
	    * [children]."
	    */
	    type->contentType = XML_SCHEMA_CONTENT_ELEMENTS;
	}
	/*
	* Compute the "content type".
	*/
	if (WXS_IS_RESTRICTION(type)) {
	    /*
	    * SPEC (3.1) "If <restriction>..."
	    * (3.1.1) + (3.1.2) */
	    if (type->contentType != XML_SCHEMA_CONTENT_EMPTY) {
		if (type->flags & XML_SCHEMAS_TYPE_MIXED)
		    type->contentType = XML_SCHEMA_CONTENT_MIXED;
	    }
	} else {
	    /*
	    * SPEC (3.2) "If <extension>..."
	    */
	    if (type->contentType == XML_SCHEMA_CONTENT_EMPTY) {
		/*
		* SPEC (3.2.1)
		* "If the `effective content` is empty, then the
		*  {content type} of the [...] base ..."
		*/
		type->contentType = baseType->contentType;
		type->subtypes = baseType->subtypes;
		/*
		* Fixes bug #347316:
		* This is the case when the base type has a simple
		* type definition as content.
		*/
		type->contentTypeDef = baseType->contentTypeDef;
		/*
		* NOTE that the effective mixed is ignored here.
		*/
	    } else if (baseType->contentType == XML_SCHEMA_CONTENT_EMPTY) {
		/*
		* SPEC (3.2.2)
		*/
		if (type->flags & XML_SCHEMAS_TYPE_MIXED)
		    type->contentType = XML_SCHEMA_CONTENT_MIXED;
	    } else {
		/*
		* SPEC (3.2.3)
		*/
		if (type->flags & XML_SCHEMAS_TYPE_MIXED)
		    type->contentType = XML_SCHEMA_CONTENT_MIXED;
		    /*
		    * "A model group whose {compositor} is sequence and whose
		    * {particles} are..."
		    */
		if ((WXS_TYPE_PARTICLE(type) != NULL) &&
		    (WXS_TYPE_PARTICLE_TERM(type) != NULL) &&
		    ((WXS_TYPE_PARTICLE_TERM(type))->type ==
			XML_SCHEMA_TYPE_ALL))
		{
		    /*
		    * SPEC cos-all-limited (1)
		    */
		    xmlSchemaCustomErr(ACTXT_CAST pctxt,
			/* TODO: error code */
			XML_SCHEMAP_COS_ALL_LIMITED,
			WXS_ITEM_NODE(type), NULL,
			"The type has an 'all' model group in its "
			"{content type} and thus cannot be derived from "
			"a non-empty type, since this would produce a "
			"'sequence' model group containing the 'all' "
			"model group; 'all' model groups are not "
			"allowed to appear inside other model groups",
			NULL, NULL);

		} else if ((WXS_TYPE_PARTICLE(baseType) != NULL) &&
		    (WXS_TYPE_PARTICLE_TERM(baseType) != NULL) &&
		    ((WXS_TYPE_PARTICLE_TERM(baseType))->type ==
			XML_SCHEMA_TYPE_ALL))
		{
		    /*
		    * SPEC cos-all-limited (1)
		    */
		    xmlSchemaCustomErr(ACTXT_CAST pctxt,
			/* TODO: error code */
			XML_SCHEMAP_COS_ALL_LIMITED,
			WXS_ITEM_NODE(type), NULL,
			"A type cannot be derived by extension from a type "
			"which has an 'all' model group in its "
			"{content type}, since this would produce a "
			"'sequence' model group containing the 'all' "
			"model group; 'all' model groups are not "
			"allowed to appear inside other model groups",
			NULL, NULL);

		} else if ((!dummySequence) && (baseType->subtypes != NULL)) {
		    xmlSchemaTreeItemPtr effectiveContent =
			(xmlSchemaTreeItemPtr) type->subtypes;
		    /*
		    * Create the particle.
		    */
		    particle = xmlSchemaAddParticle(pctxt,
			type->node, 1, 1);
		    if (particle == NULL)
			goto exit_failure;
		    /*
		    * Create the "sequence" model group.
		    */
		    particle->children = (xmlSchemaTreeItemPtr)
			xmlSchemaAddModelGroup(pctxt, pctxt->schema,
			XML_SCHEMA_TYPE_SEQUENCE, type->node);
		    if (particle->children == NULL)
			goto exit_failure;
		    WXS_TYPE_CONTENTTYPE(type) = (xmlSchemaTypePtr) particle;
		    /*
		    * SPEC "the particle of the {content type} of
		    * the ... base ..."
		    * Create a duplicate of the base type's particle
		    * and assign its "term" to it.
		    */
		    particle->children->children =
			(xmlSchemaTreeItemPtr) xmlSchemaAddParticle(pctxt,
			type->node,
			((xmlSchemaParticlePtr) baseType->subtypes)->minOccurs,
			((xmlSchemaParticlePtr) baseType->subtypes)->maxOccurs);
		    if (particle->children->children == NULL)
			goto exit_failure;
		    particle = (xmlSchemaParticlePtr)
			particle->children->children;
		    particle->children =
			((xmlSchemaParticlePtr) baseType->subtypes)->children;
		    /*
		    * SPEC "followed by the `effective content`."
		    */
		    particle->next = effectiveContent;
		    /*
		    * This all will result in:
		    * new-particle
		    *   --> new-sequence(
		    *         new-particle
		    *           --> base-model,
		    *         this-particle
		    *	        --> this-model
		    *	    )
		    */
		} else {
		    /*
		    * This is the case when there is already an empty
		    * <sequence> with minOccurs==maxOccurs==1.
		    * Just add the base types's content type.
		    * NOTE that, although we miss to add an intermediate
		    * <sequence>, this should produce no difference to
		    * neither the regex compilation of the content model,
		    * nor to the complex type constraints.
		    */
		    particle->children->children =
			(xmlSchemaTreeItemPtr) baseType->subtypes;
		}
	    }
	}
    }
    /*
    * Now fixup attribute uses:
    *   - expand attr. group references
    *     - intersect attribute wildcards
    *   - inherit attribute uses of the base type
    *   - inherit or union attr. wildcards if extending
    *   - apply attr. use prohibitions if restricting
    */
    res = xmlSchemaFixupTypeAttributeUses(pctxt, type);
    HFAILURE HERROR
    /*
    * Apply the complex type component constraints; this will not
    * check attributes, since this is done in
    * xmlSchemaFixupTypeAttributeUses().
    */
    res = xmlSchemaCheckCTComponent(pctxt, type);
    HFAILURE HERROR

    if (olderrs != pctxt->nberrors)
	return(pctxt->err);
    else
	return(0);

exit_error:
    type->flags |= XML_SCHEMAS_TYPE_INTERNAL_INVALID;
    return(pctxt->err);

exit_failure:
    type->flags |= XML_SCHEMAS_TYPE_INTERNAL_INVALID;
    return(-1);
}